

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O0

const_iterator avro::findField(Entity *e,Object *m,string *fieldName)

{
  bool bVar1;
  undefined8 uVar2;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  format *in_stack_fffffffffffffee8;
  Exception *in_stack_fffffffffffffef0;
  char *in_stack_ffffffffffffff18;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  Entity *in_stack_ffffffffffffff88;
  _Self local_28 [4];
  _Self local_8;
  
  local_8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
               *)in_stack_fffffffffffffea8,(key_type *)0x1d96a4);
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
              *)in_stack_fffffffffffffea8);
  bVar1 = std::operator==(&local_8,local_28);
  if (!bVar1) {
    return (const_iterator)local_8._M_node;
  }
  uVar2 = __cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  this = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                   (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  json::Entity::toString_abi_cxx11_(in_stack_ffffffffffffff88);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
            (this,in_stack_fffffffffffffea8);
  Exception::Exception(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

const json::Object::const_iterator findField(const Entity& e,
    const Object& m, const string& fieldName)
{
    Object::const_iterator it = m.find(fieldName);
    if (it == m.end()) {
        throw Exception(boost::format("Missing Json field \"%1%\": %2%") %
            fieldName % e.toString());
    } else {
        return it;
    }
}